

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Hacl_Frodo640.c
# Opt level: O1

uint32_t Hacl_Frodo640_crypto_kem_dec(uint8_t *ss,uint8_t *ct,uint8_t *sk)

{
  byte *pbVar1;
  uint uVar2;
  ulong uVar3;
  ulong uVar5;
  uint3 uVar6;
  undefined8 uVar7;
  uint16_t uVar8;
  uint32_t i0;
  long lVar9;
  short *psVar10;
  uint16_t *puVar11;
  uint32_t i1;
  uint16_t *puVar12;
  uint7 *puVar13;
  uint8_t *puVar14;
  uint16_t res_3;
  ushort uVar15;
  ulong uVar16;
  long lVar17;
  short *psVar18;
  int iVar19;
  ulong uVar20;
  long lVar21;
  uint16_t *puVar22;
  uint16_t res;
  ulong uVar23;
  long lVar24;
  uint16_t res_2;
  short sVar25;
  short *psVar26;
  uint16_t res_1;
  uint32_t i0_2;
  byte bVar27;
  ushort uVar28;
  uint32_t i0_3;
  uint8_t auStack_de9f8 [9720];
  uint8_t auStack_dc400 [8];
  uint8_t auStack_dc3f8 [8];
  undefined8 uStack_dc3f0;
  undefined8 uStack_dc3e8;
  undefined8 uStack_dc3e0;
  undefined8 uStack_dc3d8;
  uint8_t auStack_dc3d0 [8];
  short asStack_dc3c8 [4];
  uint16_t a_matrix [409600];
  uint8_t r [20608];
  short local_cb48 [4];
  uint16_t sp_matrix [5120];
  uint16_t ep_matrix [5120];
  uint16_t bpp_matrix [5120];
  uint16_t bp_matrix [5120];
  uint16_t b_matrix [5120];
  uint8_t shake_input_seed_se [17];
  uint8_t auStack_328 [8];
  uint8_t seed_se_k [32];
  uint8_t kp_s [16];
  uint16_t cp_matrix [64];
  uint16_t c_matrix [64];
  uint16_t m_matrix [64];
  uint16_t epp_matrix [64];
  uint16_t mu_encode [64];
  undefined8 uStack_48;
  uint8_t mu_decode [16];
  ulong uVar4;
  
  puVar11 = bpp_matrix + 0x13fc;
  builtin_memcpy(auStack_dc3d0,"\x15\x0e\x17",4);
  auStack_dc3d0[4] = '\0';
  auStack_dc3d0[5] = '\0';
  auStack_dc3d0[6] = '\0';
  auStack_dc3d0[7] = '\0';
  memset(puVar11,0,0x2800);
  c_matrix[0x34] = 0;
  c_matrix[0x35] = 0;
  c_matrix[0x36] = 0;
  c_matrix[0x37] = 0;
  c_matrix[0x38] = 0;
  c_matrix[0x39] = 0;
  c_matrix[0x3a] = 0;
  c_matrix[0x3b] = 0;
  c_matrix[0x2c] = 0;
  c_matrix[0x2d] = 0;
  c_matrix[0x2e] = 0;
  c_matrix[0x2f] = 0;
  c_matrix[0x30] = 0;
  c_matrix[0x31] = 0;
  c_matrix[0x32] = 0;
  c_matrix[0x33] = 0;
  c_matrix[0x24] = 0;
  c_matrix[0x25] = 0;
  c_matrix[0x26] = 0;
  c_matrix[0x27] = 0;
  c_matrix[0x28] = 0;
  c_matrix[0x29] = 0;
  c_matrix[0x2a] = 0;
  c_matrix[0x2b] = 0;
  c_matrix[0x1c] = 0;
  c_matrix[0x1d] = 0;
  c_matrix[0x1e] = 0;
  c_matrix[0x1f] = 0;
  c_matrix[0x20] = 0;
  c_matrix[0x21] = 0;
  c_matrix[0x22] = 0;
  c_matrix[0x23] = 0;
  c_matrix[0x14] = 0;
  c_matrix[0x15] = 0;
  c_matrix[0x16] = 0;
  c_matrix[0x17] = 0;
  c_matrix[0x18] = 0;
  c_matrix[0x19] = 0;
  c_matrix[0x1a] = 0;
  c_matrix[0x1b] = 0;
  c_matrix[0xc] = 0;
  c_matrix[0xd] = 0;
  c_matrix[0xe] = 0;
  c_matrix[0xf] = 0;
  c_matrix[0x10] = 0;
  c_matrix[0x11] = 0;
  c_matrix[0x12] = 0;
  c_matrix[0x13] = 0;
  c_matrix[4] = 0;
  c_matrix[5] = 0;
  c_matrix[6] = 0;
  c_matrix[7] = 0;
  c_matrix[8] = 0;
  c_matrix[9] = 0;
  c_matrix[10] = 0;
  c_matrix[0xb] = 0;
  cp_matrix[0x3c] = 0;
  cp_matrix[0x3d] = 0;
  cp_matrix[0x3e] = 0;
  cp_matrix[0x3f] = 0;
  c_matrix[0] = 0;
  c_matrix[1] = 0;
  c_matrix[2] = 0;
  c_matrix[3] = 0;
  lVar9 = 0xe;
  puVar13 = (uint7 *)ct;
  do {
    uVar23 = (ulong)*(uint3 *)((long)puVar13 + 4) << 0x20;
    uVar2 = (uint)*puVar13;
    uVar16 = *(ulong *)((long)puVar13 + 7);
    uVar5 = (uVar23 & 0xff0000000000) >> 0x18;
    uVar20 = uVar5 | (uVar23 & 0xff00000000) >> 8 | ((ulong)uVar2 & 0xff000000) << 8 |
             ((ulong)uVar2 & 0xff0000) << 0x18 | ((ulong)uVar2 & 0xff00) << 0x28 |
             (ulong)*puVar13 << 0x38;
    uVar3 = uVar16 >> 0x38 | (uVar16 & 0xff000000000000) >> 0x28;
    uVar4 = uVar3 | (uVar16 & 0xff0000000000) >> 0x18 | (uVar16 & 0xff00000000) >> 8;
    uVar16 = uVar4 | (uVar16 & 0xff000000) << 8 | (uVar16 & 0xff0000) << 0x18 |
             (uVar16 & 0xff00) << 0x28 | uVar16 << 0x38;
    *(ushort *)((long)bpp_matrix + lVar9 + 0x27ea) = (ushort)(uVar20 >> 0x31);
    *(ushort *)((long)bpp_matrix + lVar9 + 0x27ec) = (ushort)(uint)(uVar20 >> 0x22) & 0x7fff;
    *(ushort *)((long)bpp_matrix + lVar9 + 0x27ee) = (ushort)(uVar20 >> 0x13) & 0x7fff;
    *(ushort *)((long)bpp_matrix + lVar9 + 0x27f0) =
         (ushort)(uVar16 >> 0x3c) |
         (ushort)(((uVar23 & 0xff000000000000) >> 0x28 | uVar5) >> 4) & 0x7fff;
    *(ushort *)((long)bpp_matrix + lVar9 + 0x27f2) = (ushort)(uint)(uVar16 >> 0x2d) & 0x7fff;
    *(ushort *)((long)bpp_matrix + lVar9 + 0x27f4) = (ushort)(uVar16 >> 0x1e) & 0x7fff;
    *(ushort *)((long)bpp_matrix + lVar9 + 0x27f6) = (ushort)(uVar4 >> 0xf) & 0x7fff;
    *(ushort *)((long)bpp_matrix + lVar9 + 0x27f8) = (ushort)uVar3 & 0x7fff;
    lVar9 = lVar9 + 0x10;
    puVar13 = (uint7 *)((long)puVar13 + 0xf);
  } while (lVar9 != 0x280e);
  puVar13 = (uint7 *)(ct + 0x2580);
  lVar9 = 0xe;
  do {
    uVar23 = (ulong)*(uint3 *)((long)puVar13 + 4) << 0x20;
    uVar2 = (uint)*puVar13;
    uVar16 = *(ulong *)((long)puVar13 + 7);
    uVar5 = (uVar23 & 0xff0000000000) >> 0x18;
    uVar20 = uVar5 | (uVar23 & 0xff00000000) >> 8 | ((ulong)uVar2 & 0xff000000) << 8 |
             ((ulong)uVar2 & 0xff0000) << 0x18 | ((ulong)uVar2 & 0xff00) << 0x28 |
             (ulong)*puVar13 << 0x38;
    uVar3 = uVar16 >> 0x38 | (uVar16 & 0xff000000000000) >> 0x28;
    uVar4 = uVar3 | (uVar16 & 0xff0000000000) >> 0x18 | (uVar16 & 0xff00000000) >> 8;
    uVar16 = uVar4 | (uVar16 & 0xff000000) << 8 | (uVar16 & 0xff0000) << 0x18 |
             (uVar16 & 0xff00) << 0x28 | uVar16 << 0x38;
    *(ushort *)((long)cp_matrix + lVar9 + 0x6a) = (ushort)(uVar20 >> 0x31);
    *(ushort *)((long)cp_matrix + lVar9 + 0x6c) = (ushort)(uint)(uVar20 >> 0x22) & 0x7fff;
    *(ushort *)((long)cp_matrix + lVar9 + 0x6e) = (ushort)(uVar20 >> 0x13) & 0x7fff;
    *(ushort *)((long)cp_matrix + lVar9 + 0x70) =
         (ushort)(uVar16 >> 0x3c) |
         (ushort)(((uVar23 & 0xff000000000000) >> 0x28 | uVar5) >> 4) & 0x7fff;
    *(ushort *)((long)cp_matrix + lVar9 + 0x72) = (ushort)(uint)(uVar16 >> 0x2d) & 0x7fff;
    *(ushort *)((long)cp_matrix + lVar9 + 0x74) = (ushort)(uVar16 >> 0x1e) & 0x7fff;
    *(ushort *)((long)cp_matrix + lVar9 + 0x76) = (ushort)(uVar4 >> 0xf) & 0x7fff;
    *(ushort *)((long)cp_matrix + lVar9 + 0x78) = (ushort)uVar3 & 0x7fff;
    lVar9 = lVar9 + 0x10;
    puVar13 = (uint7 *)((long)puVar13 + 0xf);
  } while (lVar9 != 0x8e);
  uStack_48 = 0;
  mu_decode[0] = '\0';
  mu_decode[1] = '\0';
  mu_decode[2] = '\0';
  mu_decode[3] = '\0';
  mu_decode[4] = '\0';
  mu_decode[5] = '\0';
  mu_decode[6] = '\0';
  mu_decode[7] = '\0';
  m_matrix[0x34] = 0;
  m_matrix[0x35] = 0;
  m_matrix[0x36] = 0;
  m_matrix[0x37] = 0;
  m_matrix[0x38] = 0;
  m_matrix[0x39] = 0;
  m_matrix[0x3a] = 0;
  m_matrix[0x3b] = 0;
  m_matrix[0x2c] = 0;
  m_matrix[0x2d] = 0;
  m_matrix[0x2e] = 0;
  m_matrix[0x2f] = 0;
  m_matrix[0x30] = 0;
  m_matrix[0x31] = 0;
  m_matrix[0x32] = 0;
  m_matrix[0x33] = 0;
  m_matrix[0x24] = 0;
  m_matrix[0x25] = 0;
  m_matrix[0x26] = 0;
  m_matrix[0x27] = 0;
  m_matrix[0x28] = 0;
  m_matrix[0x29] = 0;
  m_matrix[0x2a] = 0;
  m_matrix[0x2b] = 0;
  m_matrix[0x1c] = 0;
  m_matrix[0x1d] = 0;
  m_matrix[0x1e] = 0;
  m_matrix[0x1f] = 0;
  m_matrix[0x20] = 0;
  m_matrix[0x21] = 0;
  m_matrix[0x22] = 0;
  m_matrix[0x23] = 0;
  m_matrix[0x14] = 0;
  m_matrix[0x15] = 0;
  m_matrix[0x16] = 0;
  m_matrix[0x17] = 0;
  m_matrix[0x18] = 0;
  m_matrix[0x19] = 0;
  m_matrix[0x1a] = 0;
  m_matrix[0x1b] = 0;
  m_matrix[0xc] = 0;
  m_matrix[0xd] = 0;
  m_matrix[0xe] = 0;
  m_matrix[0xf] = 0;
  m_matrix[0x10] = 0;
  m_matrix[0x11] = 0;
  m_matrix[0x12] = 0;
  m_matrix[0x13] = 0;
  m_matrix[4] = 0;
  m_matrix[5] = 0;
  m_matrix[6] = 0;
  m_matrix[7] = 0;
  m_matrix[8] = 0;
  m_matrix[9] = 0;
  m_matrix[10] = 0;
  m_matrix[0xb] = 0;
  c_matrix[0x3c] = 0;
  c_matrix[0x3d] = 0;
  c_matrix[0x3e] = 0;
  c_matrix[0x3f] = 0;
  m_matrix[0] = 0;
  m_matrix[1] = 0;
  m_matrix[2] = 0;
  m_matrix[3] = 0;
  builtin_memcpy(auStack_dc3d0,"O\x10\x17",4);
  auStack_dc3d0[4] = '\0';
  auStack_dc3d0[5] = '\0';
  auStack_dc3d0[6] = '\0';
  auStack_dc3d0[7] = '\0';
  memcpy(r + 0x5078,sk + 0x25a0,0x2800);
  lVar9 = 0;
  do {
    lVar17 = 0;
    puVar14 = r + 0x5078;
    do {
      lVar21 = 0;
      uVar8 = 0;
      do {
        uVar8 = uVar8 + *(short *)(puVar14 + lVar21 * 2) * puVar11[lVar21];
        lVar21 = lVar21 + 1;
      } while (lVar21 != 0x280);
      m_matrix[lVar9 * 8 + lVar17 + -4] = uVar8;
      lVar17 = lVar17 + 1;
      puVar14 = puVar14 + 0x500;
    } while (lVar17 != 8);
    lVar9 = lVar9 + 1;
    puVar11 = puVar11 + 0x280;
  } while (lVar9 != 8);
  puVar11 = c_matrix + 0x3c;
  puVar12 = cp_matrix + 0x3c;
  lVar9 = 0;
  do {
    lVar17 = 0;
    do {
      puVar11[lVar17] = puVar12[lVar17] - puVar11[lVar17];
      lVar17 = lVar17 + 1;
    } while (lVar17 != 8);
    lVar9 = lVar9 + 1;
    puVar11 = puVar11 + 8;
    puVar12 = puVar12 + 8;
  } while (lVar9 != 8);
  lVar9 = 0;
  do {
    *(uint16_t *)(mu_decode + lVar9 + -8) =
         m_matrix[lVar9 * 4 + 3] * 2 + 0x2000 & 0xc000 |
         (ushort)(*(int *)(m_matrix + lVar9 * 4 + 2) + 0x1000U >> 1) & 0x3000 |
         (ushort)(m_matrix[lVar9 * 4 + 1] + 0x1000 >> 3) & 0xc00 |
         (ushort)(*(int *)(m_matrix + lVar9 * 4) + 0x1000U >> 5) & 0x300 |
         (ushort)(m_matrix[lVar9 * 4 + -1] + 0x1000 >> 7) & 0xc0 |
         (ushort)(*(int *)(m_matrix + lVar9 * 4 + -2) + 0x1000U >> 9) & 0x30 |
         (ushort)(m_matrix[lVar9 * 4 + -3] + 0x1000 >> 0xb) & 0xc |
         (ushort)(*(int *)(m_matrix + lVar9 * 4 + -4) + 0x1000U >> 0xd) & 3;
    lVar9 = lVar9 + 2;
  } while (lVar9 != 0x10);
  auStack_dc3d0[0] = 0xa8;
  auStack_dc3d0[1] = '\x11';
  auStack_dc3d0[2] = '\x17';
  auStack_dc3d0[3] = '\0';
  auStack_dc3d0[4] = '\0';
  auStack_dc3d0[5] = '\0';
  auStack_dc3d0[6] = '\0';
  auStack_dc3d0[7] = '\0';
  Lib_Memzero0_memzero0(r + 0x5078,0x2800);
  auStack_dc3d0[0] = 0xb9;
  auStack_dc3d0[1] = '\x11';
  auStack_dc3d0[2] = '\x17';
  auStack_dc3d0[3] = '\0';
  auStack_dc3d0[4] = '\0';
  auStack_dc3d0[5] = '\0';
  auStack_dc3d0[6] = '\0';
  auStack_dc3d0[7] = '\0';
  Lib_Memzero0_memzero0(c_matrix + 0x3c,0x80);
  seed_se_k[8] = '\0';
  seed_se_k[9] = '\0';
  seed_se_k[10] = '\0';
  seed_se_k[0xb] = '\0';
  seed_se_k[0xc] = '\0';
  seed_se_k[0xd] = '\0';
  seed_se_k[0xe] = '\0';
  seed_se_k[0xf] = '\0';
  seed_se_k[0x10] = '\0';
  seed_se_k[0x11] = '\0';
  seed_se_k[0x12] = '\0';
  seed_se_k[0x13] = '\0';
  seed_se_k[0x14] = '\0';
  seed_se_k[0x15] = '\0';
  seed_se_k[0x16] = '\0';
  seed_se_k[0x17] = '\0';
  auStack_328[0] = '\0';
  auStack_328[1] = '\0';
  auStack_328[2] = '\0';
  auStack_328[3] = '\0';
  auStack_328[4] = '\0';
  auStack_328[5] = '\0';
  auStack_328[6] = '\0';
  auStack_328[7] = '\0';
  seed_se_k[0] = '\0';
  seed_se_k[1] = '\0';
  seed_se_k[2] = '\0';
  seed_se_k[3] = '\0';
  seed_se_k[4] = '\0';
  seed_se_k[5] = '\0';
  seed_se_k[6] = '\0';
  seed_se_k[7] = '\0';
  uStack_dc3e8 = *(undefined8 *)(sk + 0x4da0);
  uStack_dc3e0 = *(undefined8 *)(sk + 0x4da8);
  uStack_dc3d8 = uStack_48;
  auStack_dc3d0[0] = mu_decode[0];
  auStack_dc3d0[1] = mu_decode[1];
  auStack_dc3d0[2] = mu_decode[2];
  auStack_dc3d0[3] = mu_decode[3];
  auStack_dc3d0[4] = mu_decode[4];
  auStack_dc3d0[5] = mu_decode[5];
  auStack_dc3d0[6] = mu_decode[6];
  auStack_dc3d0[7] = mu_decode[7];
  uStack_dc3f0 = 0x171206;
  mu_decode._8_8_ = sk;
  Hacl_Hash_SHA3_shake128(auStack_328,0x20,(uint8_t *)&uStack_dc3e8,0x20);
  lVar9 = 0;
  uStack_dc3f0 = 0x17121c;
  memset(ep_matrix + 0x13fc,0,0x2800);
  cp_matrix[0x34] = 0;
  cp_matrix[0x35] = 0;
  cp_matrix[0x36] = 0;
  cp_matrix[0x37] = 0;
  cp_matrix[0x38] = 0;
  cp_matrix[0x39] = 0;
  cp_matrix[0x3a] = 0;
  cp_matrix[0x3b] = 0;
  cp_matrix[0x2c] = 0;
  cp_matrix[0x2d] = 0;
  cp_matrix[0x2e] = 0;
  cp_matrix[0x2f] = 0;
  cp_matrix[0x30] = 0;
  cp_matrix[0x31] = 0;
  cp_matrix[0x32] = 0;
  cp_matrix[0x33] = 0;
  cp_matrix[0x24] = 0;
  cp_matrix[0x25] = 0;
  cp_matrix[0x26] = 0;
  cp_matrix[0x27] = 0;
  cp_matrix[0x28] = 0;
  cp_matrix[0x29] = 0;
  cp_matrix[0x2a] = 0;
  cp_matrix[0x2b] = 0;
  cp_matrix[0x1c] = 0;
  cp_matrix[0x1d] = 0;
  cp_matrix[0x1e] = 0;
  cp_matrix[0x1f] = 0;
  cp_matrix[0x20] = 0;
  cp_matrix[0x21] = 0;
  cp_matrix[0x22] = 0;
  cp_matrix[0x23] = 0;
  cp_matrix[0x14] = 0;
  cp_matrix[0x15] = 0;
  cp_matrix[0x16] = 0;
  cp_matrix[0x17] = 0;
  cp_matrix[0x18] = 0;
  cp_matrix[0x19] = 0;
  cp_matrix[0x1a] = 0;
  cp_matrix[0x1b] = 0;
  cp_matrix[0xc] = 0;
  cp_matrix[0xd] = 0;
  cp_matrix[0xe] = 0;
  cp_matrix[0xf] = 0;
  cp_matrix[0x10] = 0;
  cp_matrix[0x11] = 0;
  cp_matrix[0x12] = 0;
  cp_matrix[0x13] = 0;
  cp_matrix[4] = 0;
  cp_matrix[5] = 0;
  cp_matrix[6] = 0;
  cp_matrix[7] = 0;
  cp_matrix[8] = 0;
  cp_matrix[9] = 0;
  cp_matrix[10] = 0;
  cp_matrix[0xb] = 0;
  kp_s[8] = '\0';
  kp_s[9] = '\0';
  kp_s[10] = '\0';
  kp_s[0xb] = '\0';
  kp_s[0xc] = '\0';
  kp_s[0xd] = '\0';
  kp_s[0xe] = '\0';
  kp_s[0xf] = '\0';
  cp_matrix[0] = 0;
  cp_matrix[1] = 0;
  cp_matrix[2] = 0;
  cp_matrix[3] = 0;
  psVar10 = local_cb48;
  uStack_dc3f0 = 0x17126d;
  memset(psVar10,0,0x2800);
  uStack_dc3f0 = 0x171280;
  memset(sp_matrix + 0x13fc,0,0x2800);
  epp_matrix[0x34] = 0;
  epp_matrix[0x35] = 0;
  epp_matrix[0x36] = 0;
  epp_matrix[0x37] = 0;
  epp_matrix[0x38] = 0;
  epp_matrix[0x39] = 0;
  epp_matrix[0x3a] = 0;
  epp_matrix[0x3b] = 0;
  epp_matrix[0x2c] = 0;
  epp_matrix[0x2d] = 0;
  epp_matrix[0x2e] = 0;
  epp_matrix[0x2f] = 0;
  epp_matrix[0x30] = 0;
  epp_matrix[0x31] = 0;
  epp_matrix[0x32] = 0;
  epp_matrix[0x33] = 0;
  epp_matrix[0x24] = 0;
  epp_matrix[0x25] = 0;
  epp_matrix[0x26] = 0;
  epp_matrix[0x27] = 0;
  epp_matrix[0x28] = 0;
  epp_matrix[0x29] = 0;
  epp_matrix[0x2a] = 0;
  epp_matrix[0x2b] = 0;
  epp_matrix[0x1c] = 0;
  epp_matrix[0x1d] = 0;
  epp_matrix[0x1e] = 0;
  epp_matrix[0x1f] = 0;
  epp_matrix[0x20] = 0;
  epp_matrix[0x21] = 0;
  epp_matrix[0x22] = 0;
  epp_matrix[0x23] = 0;
  epp_matrix[0x14] = 0;
  epp_matrix[0x15] = 0;
  epp_matrix[0x16] = 0;
  epp_matrix[0x17] = 0;
  epp_matrix[0x18] = 0;
  epp_matrix[0x19] = 0;
  epp_matrix[0x1a] = 0;
  epp_matrix[0x1b] = 0;
  epp_matrix[0xc] = 0;
  epp_matrix[0xd] = 0;
  epp_matrix[0xe] = 0;
  epp_matrix[0xf] = 0;
  epp_matrix[0x10] = 0;
  epp_matrix[0x11] = 0;
  epp_matrix[0x12] = 0;
  epp_matrix[0x13] = 0;
  epp_matrix[4] = 0;
  epp_matrix[5] = 0;
  epp_matrix[6] = 0;
  epp_matrix[7] = 0;
  epp_matrix[8] = 0;
  epp_matrix[9] = 0;
  epp_matrix[10] = 0;
  epp_matrix[0xb] = 0;
  m_matrix[0x3c] = 0;
  m_matrix[0x3d] = 0;
  m_matrix[0x3e] = 0;
  m_matrix[0x3f] = 0;
  epp_matrix[0] = 0;
  epp_matrix[1] = 0;
  epp_matrix[2] = 0;
  epp_matrix[3] = 0;
  uStack_dc3f0 = 0x1712d1;
  memset(a_matrix + 0x63ffc,0,0x5080);
  b_matrix[0x13fc]._0_1_ = 0x96;
  b_matrix._10233_7_ = auStack_328._0_7_;
  uStack_dc3f0 = 0x171307;
  Hacl_Hash_SHA3_shake128
            ((uint8_t *)(a_matrix + 0x63ffc),0x5080,(uint8_t *)(b_matrix + 0x13fc),0x11);
  uStack_dc3f0 = 0x171314;
  Lib_Memzero0_memzero0(b_matrix + 0x13fc,0x11);
  uStack_dc3f0 = 0x171323;
  memset(psVar10,0,0x2800);
  do {
    lVar17 = 0;
    do {
      lVar21 = lVar17 + lVar9 * 0x280;
      lVar24 = 0;
      iVar19 = 0;
      do {
        iVar19 = iVar19 + (((uint)*(ushort *)((long)Hacl_Impl_Frodo_Params_cdf_table640 + lVar24) -
                            (uint)(a_matrix[lVar21 + 0x63ffc] >> 1) & 0xffff) >> 0xf);
        lVar24 = lVar24 + 2;
      } while (lVar24 != 0x18);
      uVar15 = a_matrix[lVar21 + 0x63ffc] & 1;
      local_cb48[lVar21] = ((ushort)iVar19 ^ -uVar15) + uVar15;
      lVar17 = lVar17 + 1;
    } while (lVar17 != 0x280);
    lVar9 = lVar9 + 1;
  } while (lVar9 != 8);
  puVar11 = sp_matrix + 0x13fc;
  lVar9 = 0;
  uStack_dc3f0 = 0x1713b1;
  memset(puVar11,0,0x2800);
  do {
    lVar17 = 0;
    do {
      lVar21 = lVar17 + lVar9 * 0x280;
      lVar24 = 0;
      iVar19 = 0;
      do {
        iVar19 = iVar19 + (((uint)*(ushort *)((long)Hacl_Impl_Frodo_Params_cdf_table640 + lVar24) -
                            (uint)(*(ushort *)(r + lVar21 * 2 + 0x27f8) >> 1) & 0xffff) >> 0xf);
        lVar24 = lVar24 + 2;
      } while (lVar24 != 0x18);
      uVar15 = *(ushort *)(r + lVar21 * 2 + 0x27f8) & 1;
      sp_matrix[lVar21 + 0x13fc] = ((ushort)iVar19 ^ -uVar15) + uVar15;
      lVar17 = lVar17 + 1;
    } while (lVar17 != 0x280);
    lVar9 = lVar9 + 1;
  } while (lVar9 != 8);
  epp_matrix[0x34] = 0;
  epp_matrix[0x35] = 0;
  epp_matrix[0x36] = 0;
  epp_matrix[0x37] = 0;
  epp_matrix[0x38] = 0;
  epp_matrix[0x39] = 0;
  epp_matrix[0x3a] = 0;
  epp_matrix[0x3b] = 0;
  epp_matrix[0x2c] = 0;
  epp_matrix[0x2d] = 0;
  epp_matrix[0x2e] = 0;
  epp_matrix[0x2f] = 0;
  epp_matrix[0x30] = 0;
  epp_matrix[0x31] = 0;
  epp_matrix[0x32] = 0;
  epp_matrix[0x33] = 0;
  epp_matrix[0x24] = 0;
  epp_matrix[0x25] = 0;
  epp_matrix[0x26] = 0;
  epp_matrix[0x27] = 0;
  epp_matrix[0x28] = 0;
  epp_matrix[0x29] = 0;
  epp_matrix[0x2a] = 0;
  epp_matrix[0x2b] = 0;
  epp_matrix[0x1c] = 0;
  epp_matrix[0x1d] = 0;
  epp_matrix[0x1e] = 0;
  epp_matrix[0x1f] = 0;
  epp_matrix[0x20] = 0;
  epp_matrix[0x21] = 0;
  epp_matrix[0x22] = 0;
  epp_matrix[0x23] = 0;
  epp_matrix[0x14] = 0;
  epp_matrix[0x15] = 0;
  epp_matrix[0x16] = 0;
  epp_matrix[0x17] = 0;
  epp_matrix[0x18] = 0;
  epp_matrix[0x19] = 0;
  epp_matrix[0x1a] = 0;
  epp_matrix[0x1b] = 0;
  epp_matrix[0xc] = 0;
  epp_matrix[0xd] = 0;
  epp_matrix[0xe] = 0;
  epp_matrix[0xf] = 0;
  epp_matrix[0x10] = 0;
  epp_matrix[0x11] = 0;
  epp_matrix[0x12] = 0;
  epp_matrix[0x13] = 0;
  epp_matrix[4] = 0;
  epp_matrix[5] = 0;
  epp_matrix[6] = 0;
  epp_matrix[7] = 0;
  epp_matrix[8] = 0;
  epp_matrix[9] = 0;
  epp_matrix[10] = 0;
  epp_matrix[0xb] = 0;
  m_matrix[0x3c] = 0;
  m_matrix[0x3d] = 0;
  m_matrix[0x3e] = 0;
  m_matrix[0x3f] = 0;
  epp_matrix[0] = 0;
  epp_matrix[1] = 0;
  epp_matrix[2] = 0;
  epp_matrix[3] = 0;
  lVar9 = 0;
  do {
    lVar17 = 0;
    do {
      lVar21 = lVar17 + lVar9 * 8;
      lVar24 = 0;
      iVar19 = 0;
      do {
        iVar19 = iVar19 + (((uint)*(ushort *)((long)Hacl_Impl_Frodo_Params_cdf_table640 + lVar24) -
                            (uint)(*(ushort *)(r + lVar21 * 2 + 0x4ff8) >> 1) & 0xffff) >> 0xf);
        lVar24 = lVar24 + 2;
      } while (lVar24 != 0x18);
      uVar15 = *(ushort *)(r + lVar21 * 2 + 0x4ff8) & 1;
      m_matrix[lVar21 + 0x3c] = ((ushort)iVar19 ^ -uVar15) + uVar15;
      lVar17 = lVar17 + 1;
    } while (lVar17 != 8);
    lVar9 = lVar9 + 1;
  } while (lVar9 != 8);
  psVar18 = asStack_dc3c8;
  uStack_dc3f0 = 0x1714df;
  memset(psVar18,0,0xc8000);
  uStack_dc3f0 = 0x1714f2;
  memset(bp_matrix + 0x13fc,0,0x1400);
  mu_encode[0x17] = 0;
  mu_encode[0xe] = 0;
  mu_encode[5] = 0;
  epp_matrix[0x3c] = 0;
  epp_matrix._122_6_ = (undefined6)*(undefined8 *)(mu_decode._8_8_ + 0x10);
  mu_encode[0] = (uint16_t)((ulong)*(undefined8 *)(mu_decode._8_8_ + 0x10) >> 0x30);
  mu_encode._2_6_ = (undefined6)*(undefined8 *)(mu_decode._8_8_ + 0x18);
  mu_encode[4] = (uint16_t)((ulong)*(undefined8 *)(mu_decode._8_8_ + 0x18) >> 0x30);
  mu_encode._12_4_ = (undefined4)*(undefined8 *)(mu_decode._8_8_ + 0x10);
  mu_encode._16_4_ = (undefined4)((ulong)*(undefined8 *)(mu_decode._8_8_ + 0x10) >> 0x20);
  mu_encode._20_4_ = (undefined4)*(undefined8 *)(mu_decode._8_8_ + 0x18);
  mu_encode._24_4_ = (undefined4)((ulong)*(undefined8 *)(mu_decode._8_8_ + 0x18) >> 0x20);
  mu_encode[0xf] = (uint16_t)*(undefined8 *)(mu_decode._8_8_ + 0x10);
  mu_encode._32_6_ = (undefined6)((ulong)*(undefined8 *)(mu_decode._8_8_ + 0x10) >> 0x10);
  mu_encode[0x13] = (uint16_t)*(undefined8 *)(mu_decode._8_8_ + 0x18);
  mu_encode._40_6_ = (undefined6)((ulong)*(undefined8 *)(mu_decode._8_8_ + 0x18) >> 0x10);
  mu_encode._48_8_ = *(undefined8 *)(mu_decode._8_8_ + 0x10);
  mu_encode._56_8_ = *(undefined8 *)(mu_decode._8_8_ + 0x18);
  uStack_dc3f0 = 0x17154a;
  memset(psVar18,0,0xc8000);
  lVar9 = -0x280;
  puVar12 = epp_matrix + 0x3c;
  do {
    mu_encode._120_8_ = psVar18 + 0x780;
    sVar25 = (short)lVar9;
    epp_matrix[0x3c] = sVar25 + 0x280;
    mu_encode[5] = sVar25 + 0x281;
    mu_encode[0xe] = sVar25 + 0x282;
    mu_encode[0x17] = sVar25 + 0x283;
    uStack_dc3f0 = 0x1715cd;
    Hacl_Hash_SHA3_shake128((uint8_t *)(bp_matrix + 0x13fc),0x500,(uint8_t *)puVar12,0x12);
    uStack_dc3f0 = 0x1715ea;
    Hacl_Hash_SHA3_shake128((uint8_t *)(b_matrix + 0x27c),0x500,(uint8_t *)(mu_encode + 5),0x12);
    uStack_dc3f0 = 0x171607;
    Hacl_Hash_SHA3_shake128((uint8_t *)(b_matrix + 0x4fc),0x500,(uint8_t *)(mu_encode + 0xe),0x12);
    uStack_dc3f0 = 0x171624;
    Hacl_Hash_SHA3_shake128((uint8_t *)(b_matrix + 0x77c),0x500,(uint8_t *)(mu_encode + 0x17),0x12);
    uStack_dc3f0 = 0x171638;
    memcpy(psVar18,bp_matrix + 0x13fc,0x500);
    uStack_dc3f0 = 0x17164d;
    memcpy(psVar18 + 0x280,b_matrix + 0x27c,0x500);
    uStack_dc3f0 = 0x171662;
    memcpy(psVar18 + 0x500,b_matrix + 0x4fc,0x500);
    uStack_dc3f0 = 0x171677;
    memcpy((void *)mu_encode._120_8_,b_matrix + 0x77c,0x500);
    psVar18 = psVar18 + 0xa00;
    lVar9 = lVar9 + 4;
  } while (lVar9 != 0);
  lVar9 = 0;
  do {
    lVar17 = 0;
    psVar18 = asStack_dc3c8;
    do {
      lVar21 = 0;
      uVar8 = 0;
      psVar26 = psVar18;
      do {
        uVar8 = uVar8 + *psVar26 * psVar10[lVar21];
        lVar21 = lVar21 + 1;
        psVar26 = psVar26 + 0x280;
      } while (lVar21 != 0x280);
      bpp_matrix[lVar9 * 0x280 + lVar17 + -4] = uVar8;
      lVar17 = lVar17 + 1;
      psVar18 = psVar18 + 1;
    } while (lVar17 != 0x280);
    lVar9 = lVar9 + 1;
    psVar10 = psVar10 + 0x280;
  } while (lVar9 != 8);
  lVar9 = 0;
  puVar22 = ep_matrix + 0x13fc;
  do {
    lVar17 = 0;
    do {
      puVar22[lVar17] = puVar22[lVar17] + puVar11[lVar17];
      lVar17 = lVar17 + 1;
    } while (lVar17 != 0x280);
    lVar9 = lVar9 + 1;
    puVar11 = puVar11 + 0x280;
    puVar22 = puVar22 + 0x280;
  } while (lVar9 != 8);
  uStack_dc3f0 = 0x171741;
  memset(bp_matrix + 0x13fc,0,0x2800);
  uVar7 = mu_decode._8_8_;
  lVar9 = 0x27;
  puVar11 = b_matrix + 3;
  do {
    uVar6 = CONCAT12(*(undefined1 *)(mu_decode._8_8_ + -1 + lVar9),
                     *(undefined2 *)(mu_decode._8_8_ + -3 + lVar9));
    uVar23 = (ulong)uVar6 << 0x20;
    uVar2 = *(uint *)(mu_decode._8_8_ + -7 + lVar9);
    uVar16 = *(ulong *)(mu_decode._8_8_ + lVar9);
    uVar5 = (uVar23 & 0xff0000000000) >> 0x18;
    uVar20 = uVar5 | (uVar23 & 0xff00000000) >> 8 | ((ulong)uVar2 & 0xff000000) << 8 |
             ((ulong)uVar2 & 0xff0000) << 0x18 | ((ulong)uVar2 & 0xff00) << 0x28 |
             (ulong)CONCAT34(uVar6,uVar2) << 0x38;
    uVar4 = uVar16 >> 0x38 | (uVar16 & 0xff000000000000) >> 0x28;
    uVar3 = uVar4 | (uVar16 & 0xff0000000000) >> 0x18 | (uVar16 & 0xff00000000) >> 8;
    uVar16 = uVar3 | (uVar16 & 0xff000000) << 8 | (uVar16 & 0xff0000) << 0x18 |
             (uVar16 & 0xff00) << 0x28 | uVar16 << 0x38;
    puVar11[-7] = (ushort)(uVar20 >> 0x31);
    puVar11[-6] = (ushort)(uint)(uVar20 >> 0x22) & 0x7fff;
    puVar11[-5] = (ushort)(uVar20 >> 0x13) & 0x7fff;
    puVar11[-4] = (ushort)(uVar16 >> 0x3c) |
                  (ushort)(((uVar23 & 0xff000000000000) >> 0x28 | uVar5) >> 4) & 0x7fff;
    puVar11[-3] = (ushort)(uint)(uVar16 >> 0x2d) & 0x7fff;
    puVar11[-2] = (ushort)(uVar16 >> 0x1e) & 0x7fff;
    puVar11[-1] = (ushort)(uVar3 >> 0xf) & 0x7fff;
    *puVar11 = (ushort)uVar4 & 0x7fff;
    lVar9 = lVar9 + 0xf;
    puVar11 = puVar11 + 8;
  } while (lVar9 != 0x25a7);
  psVar10 = local_cb48;
  lVar9 = 0;
  do {
    lVar17 = 0;
    puVar11 = bp_matrix + 0x13fc;
    do {
      lVar21 = 0;
      sVar25 = 0;
      do {
        sVar25 = sVar25 + puVar11[lVar21 * 4] * *(short *)((long)psVar10 + lVar21);
        lVar21 = lVar21 + 2;
      } while (lVar21 != 0x500);
      *(short *)(kp_s + lVar17 * 2 + lVar9 * 0x10 + 8) = sVar25;
      lVar17 = lVar17 + 1;
      puVar11 = puVar11 + 1;
    } while (lVar17 != 8);
    lVar9 = lVar9 + 1;
    psVar10 = psVar10 + 0x280;
  } while (lVar9 != 8);
  puVar11 = m_matrix + 0x3c;
  puVar14 = kp_s + 8;
  lVar9 = 0;
  do {
    lVar17 = 0;
    do {
      *(uint16_t *)(puVar14 + lVar17 * 2) = *(short *)(puVar14 + lVar17 * 2) + puVar11[lVar17];
      lVar17 = lVar17 + 1;
    } while (lVar17 != 8);
    lVar9 = lVar9 + 1;
    puVar11 = puVar11 + 8;
    puVar14 = puVar14 + 0x10;
  } while (lVar9 != 8);
  mu_encode[0x34] = 0;
  mu_encode[0x35] = 0;
  mu_encode[0x36] = 0;
  mu_encode[0x37] = 0;
  mu_encode[0x38] = 0;
  mu_encode[0x39] = 0;
  mu_encode[0x3a] = 0;
  mu_encode[0x3b] = 0;
  mu_encode[0x2c] = 0;
  mu_encode[0x2d] = 0;
  mu_encode[0x2e] = 0;
  mu_encode[0x2f] = 0;
  mu_encode[0x30] = 0;
  mu_encode[0x31] = 0;
  mu_encode[0x32] = 0;
  mu_encode[0x33] = 0;
  mu_encode[0x24] = 0;
  mu_encode[0x25] = 0;
  mu_encode[0x26] = 0;
  mu_encode[0x27] = 0;
  mu_encode[0x28] = 0;
  mu_encode[0x29] = 0;
  mu_encode[0x2a] = 0;
  mu_encode[0x2b] = 0;
  mu_encode[0x1c] = 0;
  mu_encode[0x1d] = 0;
  mu_encode[0x1e] = 0;
  mu_encode[0x1f] = 0;
  mu_encode[0x20] = 0;
  mu_encode[0x21] = 0;
  mu_encode[0x22] = 0;
  mu_encode[0x23] = 0;
  mu_encode[0x14] = 0;
  mu_encode[0x15] = 0;
  mu_encode[0x16] = 0;
  mu_encode[0x17] = 0;
  mu_encode[0x18] = 0;
  mu_encode[0x19] = 0;
  mu_encode[0x1a] = 0;
  mu_encode[0x1b] = 0;
  mu_encode[0xc] = 0;
  mu_encode[0xd] = 0;
  mu_encode[0xe] = 0;
  mu_encode[0xf] = 0;
  mu_encode[0x10] = 0;
  mu_encode[0x11] = 0;
  mu_encode[0x12] = 0;
  mu_encode[0x13] = 0;
  mu_encode[4] = 0;
  mu_encode[5] = 0;
  mu_encode[6] = 0;
  mu_encode[7] = 0;
  mu_encode[8] = 0;
  mu_encode[9] = 0;
  mu_encode[10] = 0;
  mu_encode[0xb] = 0;
  epp_matrix[0x3c] = 0;
  epp_matrix[0x3d] = 0;
  epp_matrix[0x3e] = 0;
  epp_matrix[0x3f] = 0;
  mu_encode[0] = 0;
  mu_encode[1] = 0;
  mu_encode[2] = 0;
  mu_encode[3] = 0;
  lVar9 = 0;
  do {
    uVar15 = *(ushort *)(mu_decode + lVar9 + -8);
    mu_encode[lVar9 * 4 + -4] = (uint16_t)((uVar15 & 3) << 0xd);
    mu_encode[lVar9 * 4 + -3] = (uint16_t)((uVar15 & 0xc) << 0xb);
    mu_encode[lVar9 * 4 + -2] = (uVar15 & 0x30) << 9;
    mu_encode[lVar9 * 4 + -1] = (uVar15 & 0xc0) << 7;
    mu_encode[lVar9 * 4] = (uVar15 & 0x300) << 5;
    mu_encode[lVar9 * 4 + 1] = uVar15 * 8 & 0x6000;
    mu_encode[lVar9 * 4 + 2] = uVar15 * 2 & 0x6000;
    mu_encode[lVar9 * 4 + 3] = uVar15 >> 1 & 0x6000;
    lVar9 = lVar9 + 2;
  } while (lVar9 != 0x10);
  puVar14 = kp_s + 8;
  lVar9 = 0;
  do {
    lVar17 = 0;
    do {
      *(uint16_t *)(puVar14 + lVar17 * 2) = *(short *)(puVar14 + lVar17 * 2) + puVar12[lVar17];
      lVar17 = lVar17 + 1;
    } while (lVar17 != 8);
    lVar9 = lVar9 + 1;
    puVar12 = puVar12 + 8;
    puVar14 = puVar14 + 0x10;
  } while (lVar9 != 8);
  uStack_dc3f0 = 0x171999;
  Lib_Memzero0_memzero0(epp_matrix + 0x3c,0x80);
  puVar11 = ep_matrix + 0x13fc;
  lVar9 = 0;
  do {
    lVar17 = 0;
    do {
      pbVar1 = (byte *)((long)puVar11 + lVar17 * 2 + 1);
      *pbVar1 = *pbVar1 & 0x7f;
      lVar17 = lVar17 + 1;
    } while (lVar17 != 0x280);
    lVar9 = lVar9 + 1;
    puVar11 = puVar11 + 0x280;
  } while (lVar9 != 8);
  puVar14 = kp_s + 8;
  lVar9 = 0;
  do {
    lVar17 = 0;
    do {
      puVar14[lVar17 * 2 + 1] = puVar14[lVar17 * 2 + 1] & 0x7f;
      lVar17 = lVar17 + 1;
    } while (lVar17 != 8);
    lVar9 = lVar9 + 1;
    puVar14 = puVar14 + 0x10;
  } while (lVar9 != 8);
  uStack_dc3f0 = 0x1719fb;
  Lib_Memzero0_memzero0(local_cb48,0x2800);
  uStack_dc3f0 = 0x171a0c;
  Lib_Memzero0_memzero0(sp_matrix + 0x13fc,0x2800);
  uStack_dc3f0 = 0x171a1d;
  Lib_Memzero0_memzero0(m_matrix + 0x3c,0x80);
  uVar15 = 0xffff;
  lVar9 = 0;
  do {
    uStack_dc3f0 = 0x171a3b;
    uVar8 = FStar_UInt16_eq_mask(bpp_matrix[lVar9 + 0x13fc],ep_matrix[lVar9 + 0x13fc]);
    uVar15 = uVar15 & uVar8;
    lVar9 = lVar9 + 1;
  } while (lVar9 != 0x1400);
  uVar28 = 0xffff;
  lVar9 = 0;
  do {
    uStack_dc3f0 = 0x171a68;
    uVar8 = FStar_UInt16_eq_mask(cp_matrix[lVar9 + 0x3c],cp_matrix[lVar9 + -4]);
    uVar28 = uVar28 & uVar8;
    lVar9 = lVar9 + 1;
  } while (lVar9 != 0x40);
  bVar27 = (byte)uVar28 & (byte)uVar15;
  seed_se_k[0x19] = (seed_se_k[9] ^ *(byte *)(uVar7 + 1)) & bVar27 ^ *(byte *)(uVar7 + 1);
  seed_se_k[0x18] = (seed_se_k[8] ^ *(byte *)uVar7) & bVar27 ^ *(byte *)uVar7;
  seed_se_k[0x1a] = (seed_se_k[10] ^ *(byte *)(uVar7 + 2)) & bVar27 ^ *(byte *)(uVar7 + 2);
  seed_se_k[0x1b] = (seed_se_k[0xb] ^ *(byte *)(uVar7 + 3)) & bVar27 ^ *(byte *)(uVar7 + 3);
  seed_se_k[0x1c] = (seed_se_k[0xc] ^ *(byte *)(uVar7 + 4)) & bVar27 ^ *(byte *)(uVar7 + 4);
  seed_se_k[0x1d] = (seed_se_k[0xd] ^ *(byte *)(uVar7 + 5)) & bVar27 ^ *(byte *)(uVar7 + 5);
  seed_se_k[0x1e] = (seed_se_k[0xe] ^ *(byte *)(uVar7 + 6)) & bVar27 ^ *(byte *)(uVar7 + 6);
  seed_se_k[0x1f] = (seed_se_k[0xf] ^ *(byte *)(uVar7 + 7)) & bVar27 ^ *(byte *)(uVar7 + 7);
  kp_s[1] = (seed_se_k[0x11] ^ *(byte *)(uVar7 + 9)) & bVar27 ^ *(byte *)(uVar7 + 9);
  kp_s[0] = (seed_se_k[0x10] ^ *(byte *)(uVar7 + 8)) & bVar27 ^ *(byte *)(uVar7 + 8);
  kp_s[2] = (seed_se_k[0x12] ^ *(byte *)(uVar7 + 10)) & bVar27 ^ *(byte *)(uVar7 + 10);
  kp_s[3] = (seed_se_k[0x13] ^ *(byte *)(uVar7 + 0xb)) & bVar27 ^ *(byte *)(uVar7 + 0xb);
  kp_s[4] = (seed_se_k[0x14] ^ *(byte *)(uVar7 + 0xc)) & bVar27 ^ *(byte *)(uVar7 + 0xc);
  kp_s[5] = (seed_se_k[0x15] ^ *(byte *)(uVar7 + 0xd)) & bVar27 ^ *(byte *)(uVar7 + 0xd);
  kp_s[6] = (seed_se_k[0x16] ^ *(byte *)(uVar7 + 0xe)) & bVar27 ^ *(byte *)(uVar7 + 0xe);
  kp_s[7] = (seed_se_k[0x17] ^ *(byte *)(uVar7 + 0xf)) & bVar27 ^ *(byte *)(uVar7 + 0xf);
  memcpy(auStack_de9f8,ct,0x25f8);
  auStack_dc400[0] = seed_se_k[0x18];
  auStack_dc400[1] = seed_se_k[0x19];
  auStack_dc400[2] = seed_se_k[0x1a];
  auStack_dc400[3] = seed_se_k[0x1b];
  auStack_dc400[4] = seed_se_k[0x1c];
  auStack_dc400[5] = seed_se_k[0x1d];
  auStack_dc400[6] = seed_se_k[0x1e];
  auStack_dc400[7] = seed_se_k[0x1f];
  auStack_dc3f8[0] = kp_s[0];
  auStack_dc3f8[1] = kp_s[1];
  auStack_dc3f8[2] = kp_s[2];
  auStack_dc3f8[3] = kp_s[3];
  auStack_dc3f8[4] = kp_s[4];
  auStack_dc3f8[5] = kp_s[5];
  auStack_dc3f8[6] = kp_s[6];
  auStack_dc3f8[7] = kp_s[7];
  Hacl_Hash_SHA3_shake128(ss,0x10,auStack_de9f8,0x2608);
  Lib_Memzero0_memzero0(auStack_de9f8,0x2608);
  Lib_Memzero0_memzero0(seed_se_k + 0x18,0x10);
  Lib_Memzero0_memzero0(auStack_328,0x20);
  Lib_Memzero0_memzero0(&uStack_48,0x10);
  return 0;
}

Assistant:

uint32_t Hacl_Frodo640_crypto_kem_dec(uint8_t *ss, uint8_t *ct, uint8_t *sk)
{
  uint16_t bp_matrix[5120U] = { 0U };
  uint16_t c_matrix[64U] = { 0U };
  uint8_t *c1 = ct;
  uint8_t *c2 = ct + 9600U;
  Hacl_Impl_Frodo_Pack_frodo_unpack(8U, 640U, 15U, c1, bp_matrix);
  Hacl_Impl_Frodo_Pack_frodo_unpack(8U, 8U, 15U, c2, c_matrix);
  uint8_t mu_decode[16U] = { 0U };
  uint8_t *s_bytes = sk + 9632U;
  uint16_t s_matrix[5120U] = { 0U };
  uint16_t m_matrix[64U] = { 0U };
  Hacl_Impl_Matrix_matrix_from_lbytes(640U, 8U, s_bytes, s_matrix);
  Hacl_Impl_Matrix_matrix_mul_s(8U, 640U, 8U, bp_matrix, s_matrix, m_matrix);
  Hacl_Impl_Matrix_matrix_sub(8U, 8U, c_matrix, m_matrix);
  Hacl_Impl_Frodo_Encode_frodo_key_decode(15U, 2U, 8U, m_matrix, mu_decode);
  Lib_Memzero0_memzero(s_matrix, 5120U, uint16_t, void *);
  Lib_Memzero0_memzero(m_matrix, 64U, uint16_t, void *);
  uint8_t seed_se_k[32U] = { 0U };
  uint32_t pkh_mu_decode_len = 32U;
  KRML_CHECK_SIZE(sizeof (uint8_t), pkh_mu_decode_len);
  uint8_t pkh_mu_decode[pkh_mu_decode_len];
  memset(pkh_mu_decode, 0U, pkh_mu_decode_len * sizeof (uint8_t));
  uint8_t *pkh = sk + 19872U;
  memcpy(pkh_mu_decode, pkh, 16U * sizeof (uint8_t));
  memcpy(pkh_mu_decode + 16U, mu_decode, 16U * sizeof (uint8_t));
  Hacl_Hash_SHA3_shake128(seed_se_k, 32U, pkh_mu_decode, pkh_mu_decode_len);
  uint8_t *seed_se = seed_se_k;
  uint8_t *kp = seed_se_k + 16U;
  uint8_t *s = sk;
  uint16_t bpp_matrix[5120U] = { 0U };
  uint16_t cp_matrix[64U] = { 0U };
  uint16_t sp_matrix[5120U] = { 0U };
  uint16_t ep_matrix[5120U] = { 0U };
  uint16_t epp_matrix[64U] = { 0U };
  uint8_t r[20608U] = { 0U };
  uint8_t shake_input_seed_se[17U] = { 0U };
  shake_input_seed_se[0U] = 0x96U;
  memcpy(shake_input_seed_se + 1U, seed_se, 16U * sizeof (uint8_t));
  Hacl_Hash_SHA3_shake128(r, 20608U, shake_input_seed_se, 17U);
  Lib_Memzero0_memzero(shake_input_seed_se, 17U, uint8_t, void *);
  Hacl_Impl_Frodo_Sample_frodo_sample_matrix640(8U, 640U, r, sp_matrix);
  Hacl_Impl_Frodo_Sample_frodo_sample_matrix640(8U, 640U, r + 10240U, ep_matrix);
  Hacl_Impl_Frodo_Sample_frodo_sample_matrix640(8U, 8U, r + 20480U, epp_matrix);
  uint8_t *pk = sk + 16U;
  uint8_t *seed_a = pk;
  uint8_t *b = pk + 16U;
  KRML_CHECK_SIZE(sizeof (uint16_t), 409600U);
  uint16_t a_matrix[409600U] = { 0U };
  Hacl_Impl_Frodo_Params_frodo_gen_matrix(Spec_Frodo_Params_SHAKE128, 640U, seed_a, a_matrix);
  Hacl_Impl_Matrix_matrix_mul(8U, 640U, 640U, sp_matrix, a_matrix, bpp_matrix);
  Hacl_Impl_Matrix_matrix_add(8U, 640U, bpp_matrix, ep_matrix);
  uint16_t b_matrix[5120U] = { 0U };
  Hacl_Impl_Frodo_Pack_frodo_unpack(640U, 8U, 15U, b, b_matrix);
  Hacl_Impl_Matrix_matrix_mul(8U, 640U, 8U, sp_matrix, b_matrix, cp_matrix);
  Hacl_Impl_Matrix_matrix_add(8U, 8U, cp_matrix, epp_matrix);
  uint16_t mu_encode[64U] = { 0U };
  Hacl_Impl_Frodo_Encode_frodo_key_encode(15U, 2U, 8U, mu_decode, mu_encode);
  Hacl_Impl_Matrix_matrix_add(8U, 8U, cp_matrix, mu_encode);
  Lib_Memzero0_memzero(mu_encode, 64U, uint16_t, void *);
  Hacl_Impl_Matrix_mod_pow2(8U, 640U, 15U, bpp_matrix);
  Hacl_Impl_Matrix_mod_pow2(8U, 8U, 15U, cp_matrix);
  Lib_Memzero0_memzero(sp_matrix, 5120U, uint16_t, void *);
  Lib_Memzero0_memzero(ep_matrix, 5120U, uint16_t, void *);
  Lib_Memzero0_memzero(epp_matrix, 64U, uint16_t, void *);
  uint16_t b1 = Hacl_Impl_Matrix_matrix_eq(8U, 640U, bp_matrix, bpp_matrix);
  uint16_t b2 = Hacl_Impl_Matrix_matrix_eq(8U, 8U, c_matrix, cp_matrix);
  uint16_t mask = (uint32_t)b1 & (uint32_t)b2;
  uint16_t mask0 = mask;
  uint8_t kp_s[16U] = { 0U };
  KRML_MAYBE_FOR16(i,
    0U,
    16U,
    1U,
    uint8_t *os = kp_s;
    uint8_t uu____0 = s[i];
    uint8_t
    x = (uint32_t)uu____0 ^ ((uint32_t)(uint8_t)mask0 & ((uint32_t)kp[i] ^ (uint32_t)uu____0));
    os[i] = x;);
  uint32_t ss_init_len = 9736U;
  KRML_CHECK_SIZE(sizeof (uint8_t), ss_init_len);
  uint8_t ss_init[ss_init_len];
  memset(ss_init, 0U, ss_init_len * sizeof (uint8_t));
  memcpy(ss_init, ct, 9720U * sizeof (uint8_t));
  memcpy(ss_init + 9720U, kp_s, 16U * sizeof (uint8_t));
  Hacl_Hash_SHA3_shake128(ss, 16U, ss_init, ss_init_len);
  Lib_Memzero0_memzero(ss_init, ss_init_len, uint8_t, void *);
  Lib_Memzero0_memzero(kp_s, 16U, uint8_t, void *);
  Lib_Memzero0_memzero(seed_se_k, 32U, uint8_t, void *);
  Lib_Memzero0_memzero(mu_decode, 16U, uint8_t, void *);
  return 0U;
}